

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

void __thiscall
TPZVec<TPZMatrix<std::complex<double>_>_*>::Resize
          (TPZVec<TPZMatrix<std::complex<double>_>_*> *this,int64_t newsize,
          TPZMatrix<std::complex<double>_> **object)

{
  undefined1 auVar1 [16];
  ostream *this_00;
  ulong uVar2;
  undefined8 *in_RDX;
  ulong in_RSI;
  long in_RDI;
  int64_t i;
  int64_t large;
  TPZMatrix<std::complex<double>_> **newstore;
  ulong local_40;
  long local_30;
  void *local_20;
  
  if ((long)in_RSI < 0) {
    this_00 = std::operator<<((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize.");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::ostream::flush();
  }
  else if (in_RSI != *(ulong *)(in_RDI + 0x10)) {
    if (in_RSI == 0) {
      local_20 = (void *)0x0;
    }
    else {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = in_RSI;
      uVar2 = SUB168(auVar1 * ZEXT816(8),0);
      if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
        uVar2 = 0xffffffffffffffff;
      }
      local_20 = operator_new__(uVar2);
    }
    local_40 = in_RSI;
    if (*(long *)(in_RDI + 0x10) < (long)in_RSI) {
      local_40 = *(ulong *)(in_RDI + 0x10);
    }
    for (local_30 = 0; local_30 < (long)local_40; local_30 = local_30 + 1) {
      *(undefined8 *)((long)local_20 + local_30 * 8) =
           *(undefined8 *)(*(long *)(in_RDI + 8) + local_30 * 8);
    }
    for (; local_30 < (long)in_RSI; local_30 = local_30 + 1) {
      *(undefined8 *)((long)local_20 + local_30 * 8) = *in_RDX;
    }
    if (*(long *)(in_RDI + 8) != 0) {
      if (*(void **)(in_RDI + 8) != (void *)0x0) {
        operator_delete__(*(void **)(in_RDI + 8));
      }
      *(undefined8 *)(in_RDI + 8) = 0;
    }
    *(void **)(in_RDI + 8) = local_20;
    *(ulong *)(in_RDI + 0x10) = in_RSI;
    *(ulong *)(in_RDI + 0x18) = in_RSI;
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize,const T& object) {
#ifndef PZNODEBUG
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize." << std::endl;
		PZError.flush();
		return;
	}
#endif
	if(newsize == fNElements) return;
	T* newstore;
	if(newsize) newstore = new T[newsize];
	else newstore = 0;
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	for(;i<newsize;i++) {   // then only to case : large=fNElement < newsize
		newstore[i] = object;
	}
    if(fStore) {
        delete[] fStore;
        fStore = nullptr;
    }
	fStore = newstore;
	fNElements = newsize;//cedric 20/11/99 e 29/04/00
    fNAlloc = newsize;
}